

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

bool tinyusdz::tydra::detail::BuildSkelHierarchyImpl
               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                *visitSet,SkelNode *parentNode,vector<int,_std::allocator<int>_> *parentJointIds,
               vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *joints,
               vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *jointNames,
               vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
               *bindTransforms,
               vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
               *restTransforms,string *err)

{
  ulong uVar1;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *jointNames_00;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *joints_00;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *parentJointIds_00;
  SkelNode *visitSet_00;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  string *psVar7;
  const_reference pvVar8;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar9;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> local_1d8;
  _Base_ptr local_1c0;
  undefined1 local_1b8;
  undefined1 local_1b0 [8];
  SkelNode node;
  ulong uStack_48;
  int parentJointIdOfCurrIdx;
  size_t i;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
  *bindTransforms_local;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *jointNames_local;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *joints_local;
  vector<int,_std::allocator<int>_> *parentJointIds_local;
  SkelNode *parentNode_local;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *visitSet_local;
  
  i = (size_t)bindTransforms;
  bindTransforms_local =
       (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)jointNames;
  jointNames_local = joints;
  joints_local = (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)parentJointIds;
  parentJointIds_local = (vector<int,_std::allocator<int>_> *)parentNode;
  parentNode_local = (SkelNode *)visitSet;
  for (uStack_48 = 0; uVar1 = uStack_48,
      sVar3 = ::std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)joints_local), uVar1 < sVar3;
      uStack_48 = uStack_48 + 1) {
    sVar4 = ::std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
            count((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                  parentNode_local,&stack0xffffffffffffffb8);
    if (sVar4 == 0) {
      pvVar5 = ::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)joints_local,uStack_48);
      node.children.
      super__Vector_base<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = *pvVar5;
      if (*(int *)&parentJointIds_local[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage ==
          node.children.
          super__Vector_base<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
        SkelNode::SkelNode((SkelNode *)local_1b0);
        node.joint_name.field_2._8_4_ = (undefined4)uStack_48;
        pvVar6 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator[]
                           (jointNames_local,uStack_48);
        psVar7 = Token::str_abi_cxx11_(pvVar6);
        ::std::__cxx11::string::operator=((string *)local_1b0,(string *)psVar7);
        pvVar6 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator[]
                           ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                            bindTransforms_local,uStack_48);
        psVar7 = Token::str_abi_cxx11_(pvVar6);
        ::std::__cxx11::string::operator=
                  ((string *)(node.joint_path.field_2._M_local_buf + 8),(string *)psVar7);
        pvVar8 = ::std::
                 vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
                 operator[](bindTransforms,uStack_48);
        memcpy(&node.joint_id,pvVar8,0x80);
        pvVar8 = ::std::
                 vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
                 operator[](restTransforms,uStack_48);
        memcpy(node.bind_transform.m[3] + 3,pvVar8,0x80);
        pVar9 = ::std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                ::insert((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                          *)parentNode_local,&stack0xffffffffffffffb8);
        visitSet_00 = parentNode_local;
        parentJointIds_00 = joints_local;
        joints_00 = jointNames_local;
        jointNames_00 = bindTransforms_local;
        local_1c0 = (_Base_ptr)pVar9.first._M_node;
        local_1b8 = pVar9.second;
        ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::vector
                  (&local_1d8,bindTransforms);
        bVar2 = BuildSkelHierarchyImpl
                          ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                            *)visitSet_00,(SkelNode *)local_1b0,
                           (vector<int,_std::allocator<int>_> *)parentJointIds_00,joints_00,
                           (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                           jointNames_00,&local_1d8,restTransforms,err);
        ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
        ~vector(&local_1d8);
        bVar2 = ((bVar2 ^ 0xffU) & 1) != 0;
        if (bVar2) {
          visitSet_local._7_1_ = 0;
        }
        else {
          ::std::vector<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>::
          emplace_back<tinyusdz::tydra::SkelNode>
                    ((vector<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>
                      *)&parentJointIds_local[0xd].super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(SkelNode *)local_1b0);
        }
        SkelNode::~SkelNode((SkelNode *)local_1b0);
        if (bVar2) goto LAB_007e36fa;
      }
    }
  }
  visitSet_local._7_1_ = 1;
LAB_007e36fa:
  return (bool)(visitSet_local._7_1_ & 1);
}

Assistant:

static bool BuildSkelHierarchyImpl(
    /* inout */ std::set<size_t> &visitSet,
    /* inout */ SkelNode &parentNode,
    const std::vector<int> &parentJointIds,
    const std::vector<value::token> &joints,
    const std::vector<value::token> &jointNames,
    const std::vector<value::matrix4d> bindTransforms,
    const std::vector<value::matrix4d> &restTransforms,
    std::string *err = nullptr) {
  // Simple linear search
  for (size_t i = 0; i < parentJointIds.size(); i++) {
    if (visitSet.count(i)) {
      continue;
    }

    int parentJointIdOfCurrIdx = parentJointIds[i];
    if (parentNode.joint_id == parentJointIdOfCurrIdx) {
      DCOUT("add joint " << i << "(parent = " << parentJointIdOfCurrIdx << ")");
      SkelNode node;
      node.joint_id = int(i);
      node.joint_path = joints[i].str();
      node.joint_name = jointNames[i].str();
      node.bind_transform = bindTransforms[i];
      node.rest_transform = restTransforms[i];

      visitSet.insert(i);

      // Recursively traverse children
      if (!BuildSkelHierarchyImpl(visitSet, node,
                                  parentJointIds, joints, jointNames, bindTransforms,
                                  restTransforms, err)) {
        return false;
      }

      parentNode.children.emplace_back(std::move(node));
    }
  }

  return true;
}